

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

ostream * operator<<(ostream *out,vector<double,_std::allocator<double>_> *v)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  int local_1c;
  int i;
  vector<double,_std::allocator<double>_> *v_local;
  ostream *out_local;
  
  std::operator<<(out,"[");
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(v);
    if (sVar1 - 1 <= (ulong)(long)local_1c) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](v,(long)local_1c);
    poVar3 = (ostream *)std::ostream::operator<<(out,*pvVar2);
    std::operator<<(poVar3,", ");
    local_1c = local_1c + 1;
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::back(v);
  poVar3 = (ostream *)std::ostream::operator<<(out,*pvVar2);
  std::operator<<(poVar3,"]");
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::vector<T> &v)
{
    out << "[";
    for (auto i = 0; i < v.size() - 1; i++)
    {
        out << v[i] << ", ";
    }
    out << v.back() << "]";

    return out;
}